

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

char * SimpleString::StrStr(char *s1,char *s2)

{
  int iVar1;
  size_t n;
  
  if (*s2 != '\0') {
    for (; *s1 != '\0'; s1 = s1 + 1) {
      n = StrLen(s2);
      iVar1 = StrNCmp(s1,s2,n);
      if (iVar1 == 0) {
        return s1;
      }
    }
    s1 = (char *)0x0;
  }
  return s1;
}

Assistant:

const char* SimpleString::StrStr(const char* s1, const char* s2)
{
    if(!*s2) return s1;
    for (; *s1; s1++)
        if (StrNCmp(s1, s2, StrLen(s2)) == 0)
            return s1;
    return NULLPTR;
}